

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_compress_fast_continue
              (LZ4_stream_t *LZ4_stream,char *source,char *dest,int inputSize,int maxOutputSize,
              int acceleration)

{
  LZ4_byte *pLVar1;
  LZ4_stream_t_internal *__src;
  char cVar2;
  char cVar3;
  uint uVar4;
  BYTE *d;
  long lVar5;
  ulong *puVar6;
  long *plVar7;
  ulong *puVar8;
  char *pcVar9;
  int iVar10;
  uint uVar11;
  int *piVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  int *piVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  BYTE *e;
  ulong *puVar22;
  long *plVar23;
  ulong *puVar24;
  ulong *puVar25;
  uint uVar26;
  int iVar27;
  int *piVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  ulong *puVar32;
  ulong *puVar33;
  long *plVar34;
  ulong uVar35;
  ulong *puVar36;
  char *pcVar37;
  uint uVar38;
  long *plVar39;
  int *piVar40;
  int local_d0;
  U32 *hashTable;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  int local_90;
  char *local_88;
  
  uVar4 = (LZ4_stream->internal_donotuse).dictSize;
  pLVar1 = (LZ4_stream->internal_donotuse).dictionary;
  LZ4_renormDictT(&LZ4_stream->internal_donotuse,inputSize);
  if (acceleration < 2) {
    acceleration = 1;
  }
  if (0x10000 < acceleration) {
    acceleration = 0x10001;
  }
  uVar20 = (ulong)(LZ4_stream->internal_donotuse).dictSize;
  if (pLVar1 + uVar4 == (LZ4_byte *)source ||
      (LZ4_stream->internal_donotuse).dictSize - 4 < 0xfffffffd) {
    piVar28 = (int *)(LZ4_stream->internal_donotuse).dictionary;
    piVar16 = (int *)(pLVar1 + uVar4);
  }
  else {
    (LZ4_stream->internal_donotuse).dictSize = 0;
    (LZ4_stream->internal_donotuse).dictionary = (LZ4_byte *)source;
    uVar20 = 0;
    piVar28 = (int *)source;
    piVar16 = (int *)source;
  }
  piVar12 = (int *)(source + inputSize);
  if ((piVar28 < piVar12) && (piVar12 < piVar16)) {
    uVar17 = (int)piVar16 - (int)piVar12;
    uVar4 = 0x10000;
    if (uVar17 < 0x10000) {
      uVar4 = uVar17;
    }
    uVar20 = 0;
    if (3 < uVar17) {
      uVar20 = (ulong)uVar4;
    }
    (LZ4_stream->internal_donotuse).dictSize = (LZ4_u32)uVar20;
    piVar28 = (int *)((long)piVar16 - uVar20);
    (LZ4_stream->internal_donotuse).dictionary = (LZ4_byte *)piVar28;
  }
  uVar4 = (uint)uVar20;
  local_90 = (int)dest;
  if (piVar16 == (int *)source) {
    if (uVar4 < 0x10000) {
      uVar17 = (LZ4_stream->internal_donotuse).currentOffset;
      if (uVar4 < uVar17) {
        if (0x7e000000 < (uint)inputSize) {
          return 0;
        }
        if (inputSize != 0) {
          pcVar37 = dest + maxOutputSize;
          (LZ4_stream->internal_donotuse).dictSize = uVar4 + inputSize;
          (LZ4_stream->internal_donotuse).currentOffset = uVar17 + inputSize;
          (LZ4_stream->internal_donotuse).tableType = 2;
          plVar39 = (long *)source;
          if ((uint)inputSize < 0xd) {
LAB_0010cf46:
            pcVar9 = source + ((ulong)(uint)inputSize - (long)plVar39);
            if (pcVar37 < dest + (long)(pcVar9 + (ulong)(pcVar9 + 0xf0) / 0xff + 1)) {
              return 0;
            }
            if (pcVar9 < (char *)0xf) {
              *dest = (char)pcVar9 << 4;
            }
            else {
              *dest = -0x10;
              for (pcVar37 = pcVar9 + -0xf; dest = dest + 1, (char *)0xfe < pcVar37;
                  pcVar37 = pcVar37 + -0xff) {
                *dest = -1;
              }
              *dest = (char)pcVar37;
            }
            memcpy(dest + 1,plVar39,(size_t)pcVar9);
            return ((int)(dest + 1) + (int)pcVar9) - local_90;
          }
          lVar31 = (long)source - (ulong)uVar17;
          *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4)
               = uVar17;
          local_b8 = dest;
LAB_0010b168:
          uVar13 = 1;
          lVar5 = *(long *)((long)plVar39 + 1);
          plVar7 = (long *)((long)plVar39 + 1);
          uVar11 = acceleration << 6;
          while( true ) {
            plVar34 = (long *)(uVar13 + (long)plVar7);
            dest = local_b8;
            if (source + ((ulong)(uint)inputSize - 0xb) < plVar34) goto LAB_0010cf46;
            uVar13 = (ulong)(lVar5 * -0x30e4432345000000) >> 0x34;
            uVar26 = *(uint *)((long)LZ4_stream + uVar13 * 4);
            iVar10 = (int)plVar7;
            iVar18 = (int)lVar31;
            lVar5 = *plVar34;
            *(int *)((long)LZ4_stream + uVar13 * 4) = iVar10 - iVar18;
            if (((uVar17 - uVar4 <= uVar26) && ((uint)(iVar10 - iVar18) <= uVar26 + 0xffff)) &&
               (*(int *)(lVar31 + (ulong)uVar26) == (int)*plVar7)) break;
            uVar13 = (ulong)(uVar11 >> 6);
            uVar11 = uVar11 + 1;
            plVar7 = plVar34;
          }
          lVar30 = (ulong)uVar26 + lVar31;
          lVar5 = 0;
          cVar2 = (char)plVar7 * '\x10' + (char)plVar39 * -0x10;
          do {
            cVar3 = cVar2;
            lVar14 = lVar5;
            piVar28 = (int *)(lVar30 + lVar14);
            plVar34 = (long *)((long)plVar7 + lVar14);
            if ((piVar28 <= source + -uVar20) || (plVar34 <= plVar39)) break;
            lVar5 = lVar14 + -1;
            cVar2 = cVar3 + -0x10;
          } while (*(char *)((long)plVar7 + lVar14 + -1) == *(char *)(lVar30 + -1 + lVar14));
          local_d0 = (int)plVar39;
          uVar13 = (ulong)(uint)((iVar10 - local_d0) + (int)lVar14);
          uVar35 = (ulong)(uint)(iVar10 - local_d0) + lVar14;
          if (pcVar37 < local_b8 + (uVar35 & 0xffffffff) / 0xff + uVar13 + 9) {
            return 0;
          }
          if ((uint)uVar35 < 0xf) {
            plVar7 = (long *)(local_b8 + 1);
            *local_b8 = cVar3;
          }
          else {
            *local_b8 = -0x10;
            plVar7 = (long *)(local_b8 + 2);
            for (iVar10 = (iVar10 - local_d0) + (int)lVar14 + -0xf; 0xfe < iVar10;
                iVar10 = iVar10 + -0xff) {
              *(char *)((long)plVar7 + -1) = -1;
              plVar7 = (long *)((long)plVar7 + 1);
            }
            *(char *)((long)plVar7 + -1) = (char)iVar10;
          }
          plVar23 = (long *)(uVar13 + (long)plVar7);
          do {
            *plVar7 = *plVar39;
            plVar7 = plVar7 + 1;
            plVar39 = plVar39 + 1;
          } while (plVar7 < plVar23);
          do {
            *(short *)plVar23 = (short)plVar34 - (short)piVar28;
            puVar33 = (ulong *)((long)plVar34 + 4);
            puVar8 = (ulong *)(piVar28 + 1);
            puVar36 = puVar33;
            if (source + ((ulong)(uint)inputSize - 0xc) <= puVar33) {
LAB_0010b33f:
              iVar10 = ((int)puVar36 - (int)plVar34) + -4;
LAB_0010b347:
              if (puVar36 < source + ((ulong)(uint)inputSize - 0xc)) {
                if (*puVar8 == *puVar36) goto code_r0x0010b35b;
                uVar35 = *puVar36 ^ *puVar8;
                uVar13 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                  }
                }
                uVar11 = ((uint)(uVar13 >> 3) & 0x1fffffff) + iVar10;
              }
              else {
                if ((puVar36 < source + ((ulong)(uint)inputSize - 8)) &&
                   ((int)*puVar8 == (int)*puVar36)) {
                  puVar36 = (ulong *)((long)puVar36 + 4);
                  puVar8 = (ulong *)((long)puVar8 + 4);
                }
                if ((puVar36 < source + ((ulong)(uint)inputSize - 6)) &&
                   ((short)*puVar8 == (short)*puVar36)) {
                  puVar36 = (ulong *)((long)puVar36 + 2);
                  puVar8 = (ulong *)((long)puVar8 + 2);
                }
                if (puVar36 < source + ((ulong)(uint)inputSize - 5)) {
                  puVar36 = (ulong *)((long)puVar36 + (ulong)((char)*puVar8 == (char)*puVar36));
                }
                uVar11 = (int)puVar36 - (int)puVar33;
              }
              goto LAB_0010b380;
            }
            if (*puVar8 == *puVar33) {
              puVar8 = (ulong *)(piVar28 + 3);
              puVar36 = (ulong *)((long)plVar34 + 0xc);
              goto LAB_0010b33f;
            }
            uVar13 = *puVar33 ^ *puVar8;
            lVar5 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
              }
            }
            uVar11 = (uint)lVar5 >> 3;
LAB_0010b380:
            if (pcVar37 < (char *)((long)plVar23 + (ulong)(uVar11 + 0xf0) / 0xff + 8)) {
              return 0;
            }
            dest = (char *)((long)plVar23 + 2);
            if (uVar11 < 0xf) {
              *local_b8 = *local_b8 + (char)uVar11;
            }
            else {
              *local_b8 = *local_b8 + '\x0f';
              dest[0] = -1;
              dest[1] = -1;
              dest[2] = -1;
              dest[3] = -1;
              lVar5 = 0;
              for (uVar26 = uVar11 - 0xf; 0x3fb < uVar26; uVar26 = uVar26 - 0x3fc) {
                pcVar9 = (char *)((long)plVar23 + lVar5 + 6);
                pcVar9[0] = -1;
                pcVar9[1] = -1;
                pcVar9[2] = -1;
                pcVar9[3] = -1;
                lVar5 = lVar5 + 4;
              }
              lVar30 = lVar5 + ((ulong)uVar26 & 0xffff) / 0xff;
              dest = (char *)((long)plVar23 + lVar30 + 3);
              *(char *)((long)plVar23 + lVar30 + 2) =
                   (char)lVar5 + (char)((uVar26 & 0xffff) / 0xff) + (char)uVar11 + -0xf;
            }
            lVar5 = (long)plVar34 + (ulong)uVar11;
            plVar39 = (long *)(lVar5 + 4);
            if (source + ((ulong)(uint)inputSize - 0xb) <= plVar39) goto LAB_0010cf46;
            *(int *)((long)LZ4_stream +
                    ((ulong)(*(long *)(lVar5 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
                 ((int)lVar5 + 2) - iVar18;
            uVar13 = (ulong)(*plVar39 * -0x30e4432345000000) >> 0x34;
            uVar26 = (int)plVar39 - iVar18;
            uVar11 = *(uint *)((long)LZ4_stream + uVar13 * 4);
            piVar28 = (int *)((ulong)uVar11 + lVar31);
            *(uint *)((long)LZ4_stream + uVar13 * 4) = uVar26;
            local_b8 = dest;
            if (((uVar11 < uVar17 - uVar4) || (uVar11 + 0xffff < uVar26)) ||
               (*piVar28 != *(int *)plVar39)) goto LAB_0010b168;
            plVar23 = (long *)(dest + 1);
            *dest = '\0';
            plVar34 = plVar39;
          } while( true );
        }
        goto LAB_0010cd24;
      }
    }
    if (0x7e000000 < (uint)inputSize) {
      return 0;
    }
    if (inputSize != 0) {
      uVar17 = (LZ4_stream->internal_donotuse).currentOffset;
      pcVar37 = dest + maxOutputSize;
      (LZ4_stream->internal_donotuse).dictSize = uVar4 + inputSize;
      (LZ4_stream->internal_donotuse).currentOffset = uVar17 + inputSize;
      (LZ4_stream->internal_donotuse).tableType = 2;
      plVar39 = (long *)source;
      if ((uint)inputSize < 0xd) {
LAB_0010cd47:
        pcVar9 = source + ((ulong)(uint)inputSize - (long)plVar39);
        if (pcVar37 < dest + (long)(pcVar9 + (ulong)(pcVar9 + 0xf0) / 0xff + 1)) {
          return 0;
        }
        if (pcVar9 < (char *)0xf) {
          *dest = (char)pcVar9 << 4;
        }
        else {
          *dest = -0x10;
          for (pcVar37 = pcVar9 + -0xf; dest = dest + 1, (char *)0xfe < pcVar37;
              pcVar37 = pcVar37 + -0xff) {
            *dest = -1;
          }
          *dest = (char)pcVar37;
        }
        memcpy(dest + 1,plVar39,(size_t)pcVar9);
        return ((int)(dest + 1) + (int)pcVar9) - local_90;
      }
      lVar31 = (long)source - (ulong)uVar17;
      *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
           uVar17;
      pcVar9 = dest;
LAB_0010b572:
      uVar13 = 1;
      lVar5 = *(long *)((long)plVar39 + 1);
      plVar7 = (long *)((long)plVar39 + 1);
      uVar4 = acceleration << 6;
      while( true ) {
        plVar34 = (long *)(uVar13 + (long)plVar7);
        dest = pcVar9;
        if (source + ((ulong)(uint)inputSize - 0xb) < plVar34) goto LAB_0010cd47;
        uVar13 = (ulong)(lVar5 * -0x30e4432345000000) >> 0x34;
        uVar17 = *(uint *)((long)LZ4_stream + uVar13 * 4);
        iVar10 = (int)plVar7;
        iVar18 = (int)lVar31;
        lVar5 = *plVar34;
        *(int *)((long)LZ4_stream + uVar13 * 4) = iVar10 - iVar18;
        if (((uint)(iVar10 - iVar18) <= uVar17 + 0xffff) &&
           (*(int *)(lVar31 + (ulong)uVar17) == (int)*plVar7)) break;
        uVar13 = (ulong)(uVar4 >> 6);
        uVar4 = uVar4 + 1;
        plVar7 = plVar34;
      }
      lVar30 = (ulong)uVar17 + lVar31;
      lVar5 = 0;
      cVar2 = (char)plVar7 * '\x10' + (char)plVar39 * -0x10;
      do {
        cVar3 = cVar2;
        lVar14 = lVar5;
        piVar28 = (int *)(lVar30 + lVar14);
        plVar34 = (long *)((long)plVar7 + lVar14);
        if ((piVar28 <= source + -uVar20) || (plVar34 <= plVar39)) break;
        lVar5 = lVar14 + -1;
        cVar2 = cVar3 + -0x10;
      } while (*(char *)((long)plVar7 + lVar14 + -1) == *(char *)(lVar30 + -1 + lVar14));
      local_d0 = (int)plVar39;
      uVar35 = (ulong)(uint)((iVar10 - local_d0) + (int)lVar14);
      uVar13 = (ulong)(uint)(iVar10 - local_d0) + lVar14;
      if (pcVar37 < pcVar9 + (uVar13 & 0xffffffff) / 0xff + uVar35 + 9) {
        return 0;
      }
      if ((uint)uVar13 < 0xf) {
        plVar7 = (long *)(pcVar9 + 1);
        *pcVar9 = cVar3;
      }
      else {
        *pcVar9 = -0x10;
        plVar7 = (long *)(pcVar9 + 2);
        for (iVar10 = (iVar10 - local_d0) + (int)lVar14 + -0xf; 0xfe < iVar10;
            iVar10 = iVar10 + -0xff) {
          *(char *)((long)plVar7 + -1) = -1;
          plVar7 = (long *)((long)plVar7 + 1);
        }
        *(char *)((long)plVar7 + -1) = (char)iVar10;
      }
      plVar23 = (long *)(uVar35 + (long)plVar7);
      do {
        *plVar7 = *plVar39;
        plVar7 = plVar7 + 1;
        plVar39 = plVar39 + 1;
      } while (plVar7 < plVar23);
      do {
        *(short *)plVar23 = (short)plVar34 - (short)piVar28;
        puVar33 = (ulong *)((long)plVar34 + 4);
        puVar8 = (ulong *)(piVar28 + 1);
        puVar36 = puVar33;
        if (source + ((ulong)(uint)inputSize - 0xc) <= puVar33) {
LAB_0010b737:
          iVar10 = ((int)puVar36 - (int)plVar34) + -4;
LAB_0010b73f:
          if (puVar36 < source + ((ulong)(uint)inputSize - 0xc)) {
            if (*puVar8 == *puVar36) goto code_r0x0010b753;
            uVar35 = *puVar36 ^ *puVar8;
            uVar13 = 0;
            if (uVar35 != 0) {
              for (; (uVar35 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
              }
            }
            uVar4 = ((uint)(uVar13 >> 3) & 0x1fffffff) + iVar10;
          }
          else {
            if ((puVar36 < source + ((ulong)(uint)inputSize - 8)) && ((int)*puVar8 == (int)*puVar36)
               ) {
              puVar36 = (ulong *)((long)puVar36 + 4);
              puVar8 = (ulong *)((long)puVar8 + 4);
            }
            if ((puVar36 < source + ((ulong)(uint)inputSize - 6)) &&
               ((short)*puVar8 == (short)*puVar36)) {
              puVar36 = (ulong *)((long)puVar36 + 2);
              puVar8 = (ulong *)((long)puVar8 + 2);
            }
            if (puVar36 < source + ((ulong)(uint)inputSize - 5)) {
              puVar36 = (ulong *)((long)puVar36 + (ulong)((char)*puVar8 == (char)*puVar36));
            }
            uVar4 = (int)puVar36 - (int)puVar33;
          }
          goto LAB_0010b778;
        }
        if (*puVar8 == *puVar33) {
          puVar8 = (ulong *)(piVar28 + 3);
          puVar36 = (ulong *)((long)plVar34 + 0xc);
          goto LAB_0010b737;
        }
        uVar13 = *puVar33 ^ *puVar8;
        lVar5 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
          }
        }
        uVar4 = (uint)lVar5 >> 3;
LAB_0010b778:
        if (pcVar37 < (char *)((long)plVar23 + (ulong)(uVar4 + 0xf0) / 0xff + 8)) {
          return 0;
        }
        dest = (char *)((long)plVar23 + 2);
        if (uVar4 < 0xf) {
          *pcVar9 = *pcVar9 + (char)uVar4;
        }
        else {
          *pcVar9 = *pcVar9 + '\x0f';
          dest[0] = -1;
          dest[1] = -1;
          dest[2] = -1;
          dest[3] = -1;
          lVar5 = 0;
          for (uVar17 = uVar4 - 0xf; 0x3fb < uVar17; uVar17 = uVar17 - 0x3fc) {
            pcVar9 = (char *)((long)plVar23 + lVar5 + 6);
            pcVar9[0] = -1;
            pcVar9[1] = -1;
            pcVar9[2] = -1;
            pcVar9[3] = -1;
            lVar5 = lVar5 + 4;
          }
          lVar30 = lVar5 + ((ulong)uVar17 & 0xffff) / 0xff;
          dest = (char *)((long)plVar23 + lVar30 + 3);
          *(char *)((long)plVar23 + lVar30 + 2) =
               (char)lVar5 + (char)((uVar17 & 0xffff) / 0xff) + (char)uVar4 + -0xf;
        }
        lVar5 = (long)plVar34 + (ulong)uVar4;
        plVar39 = (long *)(lVar5 + 4);
        if (source + ((ulong)(uint)inputSize - 0xb) <= plVar39) goto LAB_0010cd47;
        *(int *)((long)LZ4_stream +
                ((ulong)(*(long *)(lVar5 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
             ((int)lVar5 + 2) - iVar18;
        uVar13 = (ulong)(*plVar39 * -0x30e4432345000000) >> 0x34;
        uVar17 = (int)plVar39 - iVar18;
        uVar4 = *(uint *)((long)LZ4_stream + uVar13 * 4);
        piVar28 = (int *)((ulong)uVar4 + lVar31);
        *(uint *)((long)LZ4_stream + uVar13 * 4) = uVar17;
        pcVar9 = dest;
        if ((uVar4 + 0xffff < uVar17) || (*piVar28 != *(int *)plVar39)) goto LAB_0010b572;
        plVar23 = (long *)(dest + 1);
        *dest = '\0';
        plVar34 = plVar39;
      } while( true );
    }
LAB_0010cd24:
    if (maxOutputSize < 1) {
      return 0;
    }
    *dest = '\0';
    return 1;
  }
  __src = (LZ4_stream->internal_donotuse).dictCtx;
  puVar33 = (ulong *)source;
  local_a8 = dest;
  if (__src == (LZ4_stream_t_internal *)0x0) {
    if (uVar4 < 0x10000) {
      uVar17 = (LZ4_stream->internal_donotuse).currentOffset;
      if (uVar4 < uVar17) {
        iVar10 = 0;
        if (0x7e000000 < (uint)inputSize) goto LAB_0010cf03;
        if (inputSize != 0) {
          lVar5 = uVar20 + (long)piVar28;
          lVar31 = lVar5 - (ulong)uVar17;
          if (piVar28 == (int *)0x0) {
            lVar31 = 0;
          }
          pcVar37 = dest + maxOutputSize;
          (LZ4_stream->internal_donotuse).dictSize = uVar4 + inputSize;
          (LZ4_stream->internal_donotuse).currentOffset = uVar17 + inputSize;
          (LZ4_stream->internal_donotuse).tableType = 2;
          if (0xc < (uint)inputSize) {
            lVar30 = (long)source - (ulong)uVar17;
            if (piVar28 == (int *)0x0) {
              lVar5 = 0;
            }
            puVar36 = (ulong *)(source + ((ulong)(uint)inputSize - 5));
            *(uint *)((long)LZ4_stream +
                     ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) = uVar17;
            puVar8 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
            local_88 = dest;
LAB_0010b9d9:
            uVar13 = 1;
            uVar20 = *(ulong *)((long)puVar33 + 1);
            puVar6 = (ulong *)((long)puVar33 + 1);
            uVar11 = acceleration << 6;
            do {
              puVar32 = (ulong *)(uVar13 + (long)puVar6);
              dest = local_88;
              if (source + ((ulong)(uint)inputSize - 0xb) < puVar32) break;
              uVar13 = uVar20 * -0x30e4432345000000 >> 0x34;
              iVar18 = (int)puVar6;
              iVar21 = (int)lVar30;
              uVar38 = iVar18 - iVar21;
              uVar26 = *(uint *)((long)LZ4_stream + uVar13 * 4);
              uVar20 = *puVar32;
              *(uint *)((long)LZ4_stream + uVar13 * 4) = uVar38;
              if ((uVar17 - uVar4 <= uVar26) && (uVar38 <= uVar26 + 0xffff)) {
                lVar14 = lVar31;
                if (uVar17 <= uVar26) {
                  lVar14 = lVar30;
                }
                if (*(int *)(lVar14 + (ulong)uVar26) == (int)*puVar6) goto LAB_0010ba50;
              }
              uVar13 = (ulong)(uVar11 >> 6);
              uVar11 = uVar11 + 1;
              puVar6 = puVar32;
            } while( true );
          }
LAB_0010cfb2:
          pcVar9 = source + ((ulong)(uint)inputSize - (long)puVar33);
          iVar10 = 0;
          if (pcVar37 < dest + (long)(pcVar9 + (ulong)(pcVar9 + 0xf0) / 0xff + 1))
          goto LAB_0010cf03;
          if (pcVar9 < (char *)0xf) {
            *dest = (char)pcVar9 << 4;
          }
          else {
            *dest = -0x10;
            for (pcVar37 = pcVar9 + -0xf; dest = dest + 1, (char *)0xfe < pcVar37;
                pcVar37 = pcVar37 + -0xff) {
              *dest = -1;
            }
            *dest = (char)pcVar37;
          }
          goto LAB_0010ce93;
        }
        goto LAB_0010cd0c;
      }
    }
    iVar10 = 0;
    if (0x7e000000 < (uint)inputSize) goto LAB_0010cf03;
    if (inputSize != 0) {
      uVar17 = (LZ4_stream->internal_donotuse).currentOffset;
      lVar5 = uVar20 + (long)piVar28;
      lVar31 = lVar5 - (ulong)uVar17;
      if (piVar28 == (int *)0x0) {
        lVar31 = 0;
      }
      pcVar37 = dest + maxOutputSize;
      (LZ4_stream->internal_donotuse).dictSize = uVar4 + inputSize;
      (LZ4_stream->internal_donotuse).currentOffset = uVar17 + inputSize;
      (LZ4_stream->internal_donotuse).tableType = 2;
      if (0xc < (uint)inputSize) {
        lVar30 = (long)source - (ulong)uVar17;
        if (piVar28 == (int *)0x0) {
          lVar5 = 0;
        }
        puVar36 = (ulong *)(source + ((ulong)(uint)inputSize - 5));
        *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             uVar17;
        puVar8 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
LAB_0010c767:
        uVar13 = 1;
        uVar20 = *(ulong *)((long)puVar33 + 1);
        puVar6 = (ulong *)((long)puVar33 + 1);
        uVar4 = acceleration << 6;
        do {
          puVar32 = (ulong *)(uVar13 + (long)puVar6);
          dest = local_a8;
          if (source + ((ulong)(uint)inputSize - 0xb) < puVar32) break;
          uVar13 = uVar20 * -0x30e4432345000000 >> 0x34;
          iVar18 = (int)puVar6;
          iVar21 = (int)lVar30;
          uVar26 = iVar18 - iVar21;
          uVar11 = *(uint *)((long)LZ4_stream + uVar13 * 4);
          uVar20 = *puVar32;
          *(uint *)((long)LZ4_stream + uVar13 * 4) = uVar26;
          if (uVar26 <= uVar11 + 0xffff) {
            lVar14 = lVar31;
            if (uVar17 <= uVar11) {
              lVar14 = lVar30;
            }
            if (*(int *)(lVar14 + (ulong)uVar11) == (int)*puVar6) goto LAB_0010c7ca;
          }
          uVar13 = (ulong)(uVar4 >> 6);
          uVar4 = uVar4 + 1;
          puVar6 = puVar32;
        } while( true );
      }
LAB_0010ce28:
      pcVar9 = source + ((ulong)(uint)inputSize - (long)puVar33);
      iVar10 = 0;
      if (pcVar37 < dest + (long)(pcVar9 + (ulong)(pcVar9 + 0xf0) / 0xff + 1)) goto LAB_0010cf03;
      if (pcVar9 < (char *)0xf) {
        *dest = (char)pcVar9 << 4;
      }
      else {
        *dest = -0x10;
        for (pcVar37 = pcVar9 + -0xf; dest = dest + 1, (char *)0xfe < pcVar37;
            pcVar37 = pcVar37 + -0xff) {
          *dest = -1;
        }
        *dest = (char)pcVar37;
      }
      goto LAB_0010cef0;
    }
  }
  else {
    if (0x1000 < inputSize) {
      memcpy(LZ4_stream,__src,0x4020);
      iVar10 = 0;
      if ((uint)inputSize < 0x7e000001) {
        uVar4 = (LZ4_stream->internal_donotuse).currentOffset;
        lVar30 = (long)source - (ulong)uVar4;
        piVar28 = (int *)(LZ4_stream->internal_donotuse).dictionary;
        lVar31 = (ulong)(LZ4_stream->internal_donotuse).dictSize + (long)piVar28;
        lVar5 = lVar31 - (ulong)uVar4;
        if (piVar28 == (int *)0x0) {
          lVar31 = 0;
        }
        puVar8 = (ulong *)(source + ((ulong)(uint)inputSize - 5));
        if (piVar28 == (int *)0x0) {
          lVar5 = 0;
        }
        pcVar37 = dest + maxOutputSize;
        (LZ4_stream->internal_donotuse).dictSize =
             (LZ4_stream->internal_donotuse).dictSize + inputSize;
        (LZ4_stream->internal_donotuse).currentOffset = uVar4 + inputSize;
        (LZ4_stream->internal_donotuse).tableType = 2;
        *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             uVar4;
        puVar36 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
        local_b0 = dest;
LAB_0010ab31:
        uVar13 = 1;
        uVar20 = *(ulong *)((long)puVar33 + 1);
        puVar6 = (ulong *)((long)puVar33 + 1);
        uVar17 = acceleration << 6;
        do {
          puVar32 = (ulong *)(uVar13 + (long)puVar6);
          dest = local_b0;
          if (source + ((ulong)(uint)inputSize - 0xb) < puVar32) goto LAB_0010cca8;
          uVar13 = uVar20 * -0x30e4432345000000 >> 0x34;
          iVar18 = (int)puVar6;
          iVar21 = (int)lVar30;
          uVar26 = iVar18 - iVar21;
          uVar11 = *(uint *)((long)LZ4_stream + uVar13 * 4);
          uVar20 = *puVar32;
          *(uint *)((long)LZ4_stream + uVar13 * 4) = uVar26;
          if (uVar26 <= uVar11 + 0xffff) {
            lVar14 = lVar5;
            if (uVar4 <= uVar11) {
              lVar14 = lVar30;
            }
            if (*(int *)(lVar14 + (ulong)uVar11) == (int)*puVar6) goto LAB_0010aba0;
          }
          uVar13 = (ulong)(uVar17 >> 6);
          uVar17 = uVar17 + 1;
          puVar6 = puVar32;
        } while( true );
      }
      goto LAB_0010cf03;
    }
    iVar10 = 0;
    if (0x7e000000 < (uint)inputSize) goto LAB_0010cf03;
    if (inputSize != 0) {
      uVar4 = (LZ4_stream->internal_donotuse).currentOffset;
      piVar28 = (int *)__src->dictionary;
      uVar17 = __src->currentOffset;
      lVar5 = (ulong)__src->dictSize + (long)piVar28;
      lVar31 = lVar5 - (ulong)uVar17;
      if (piVar28 == (int *)0x0) {
        lVar31 = 0;
      }
      LZ4_stream->table[0x802] = (void *)0x0;
      pcVar37 = dest + maxOutputSize;
      (LZ4_stream->internal_donotuse).dictSize = inputSize;
      (LZ4_stream->internal_donotuse).currentOffset = uVar4 + inputSize;
      (LZ4_stream->internal_donotuse).tableType = 2;
      if (0xc < (uint)inputSize) {
        lVar30 = (long)source - (ulong)uVar4;
        iVar18 = uVar4 - uVar17;
        puVar8 = (ulong *)(source + ((ulong)(uint)inputSize - 5));
        if (piVar28 == (int *)0x0) {
          lVar5 = 0;
        }
        *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             uVar4;
        puVar36 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
LAB_0010c09c:
        uVar20 = *(ulong *)((long)puVar33 + 1);
        uVar13 = 1;
        puVar6 = (ulong *)((long)puVar33 + 1);
        uVar17 = acceleration << 6;
        while( true ) {
          puVar32 = (ulong *)(uVar13 + (long)puVar6);
          dest = local_a8;
          if (source + ((ulong)(uint)inputSize - 0xb) < puVar32) goto LAB_0010cdb9;
          uVar13 = uVar20 * -0x30e4432345000000 >> 0x34;
          uVar11 = *(uint *)((long)LZ4_stream + uVar13 * 4);
          if (uVar11 < uVar4) {
            uVar11 = __src->hashTable[uVar13] + iVar18;
            piVar16 = (int *)((ulong)__src->hashTable[uVar13] + lVar31);
            piVar12 = piVar28;
          }
          else {
            piVar16 = (int *)((ulong)uVar11 + lVar30);
            piVar12 = (int *)source;
          }
          iVar27 = (int)puVar6;
          iVar21 = (int)lVar30;
          uVar26 = iVar27 - iVar21;
          uVar20 = *puVar32;
          *(uint *)((long)LZ4_stream + uVar13 * 4) = uVar26;
          if ((uVar26 <= uVar11 + 0xffff) && (*piVar16 == (int)*puVar6)) break;
          uVar13 = (ulong)(uVar17 >> 6);
          uVar17 = uVar17 + 1;
          puVar6 = puVar32;
        }
        iVar29 = uVar26 - uVar11;
        lVar14 = 0;
        cVar2 = (char)puVar6 * '\x10' + (char)puVar33 * -0x10;
        do {
          cVar3 = cVar2;
          lVar19 = lVar14;
          piVar40 = (int *)((long)piVar16 + lVar19);
          puVar32 = (ulong *)((long)puVar6 + lVar19);
          if ((piVar40 <= piVar12) || (puVar32 <= puVar33)) break;
          lVar14 = lVar19 + -1;
          cVar2 = cVar3 + -0x10;
        } while (*(char *)((long)puVar6 + lVar19 + -1) == *(char *)((long)piVar16 + lVar19 + -1));
        uVar17 = iVar27 - (int)puVar33;
        uVar20 = (ulong)(uVar17 + (int)lVar19);
        uVar13 = (ulong)uVar17 + lVar19;
        iVar10 = 0;
        if (local_a8 + (uVar13 & 0xffffffff) / 0xff + uVar20 + 9 <= pcVar37) {
          if ((uint)uVar13 < 0xf) {
            puVar6 = (ulong *)(local_a8 + 1);
            *local_a8 = cVar3;
          }
          else {
            *local_a8 = -0x10;
            puVar6 = (ulong *)(local_a8 + 2);
            for (iVar10 = (iVar27 - (int)puVar33) + (int)lVar19 + -0xf; 0xfe < iVar10;
                iVar10 = iVar10 + -0xff) {
              *(char *)((long)puVar6 + -1) = -1;
              puVar6 = (ulong *)((long)puVar6 + 1);
            }
            *(char *)((long)puVar6 + -1) = (char)iVar10;
          }
          puVar22 = (ulong *)(uVar20 + (long)puVar6);
          do {
            *puVar6 = *puVar33;
            puVar6 = puVar6 + 1;
            puVar33 = puVar33 + 1;
          } while (puVar6 < puVar22);
          do {
            *(short *)puVar22 = (short)iVar29;
            if (piVar12 == piVar28) {
              puVar6 = (ulong *)((lVar5 - (long)piVar40) + (long)puVar32);
              if (puVar8 < puVar6) {
                puVar6 = puVar8;
              }
              puVar33 = (ulong *)((long)puVar32 + 4);
              puVar24 = (ulong *)(piVar40 + 1);
              puVar25 = puVar33;
              if ((ulong *)((long)puVar6 - 7U) <= puVar33) {
LAB_0010c3f5:
                iVar10 = ((int)puVar25 - (int)puVar32) + -4;
LAB_0010c3ff:
                if (puVar25 < (ulong *)((long)puVar6 - 7U)) {
                  if (*puVar24 == *puVar25) goto code_r0x0010c413;
                  uVar13 = *puVar25 ^ *puVar24;
                  uVar20 = 0;
                  if (uVar13 != 0) {
                    for (; (uVar13 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                    }
                  }
                  uVar17 = ((uint)(uVar20 >> 3) & 0x1fffffff) + iVar10;
                }
                else {
                  if ((puVar25 < (ulong *)((long)puVar6 - 3U)) && ((int)*puVar24 == (int)*puVar25))
                  {
                    puVar25 = (ulong *)((long)puVar25 + 4);
                    puVar24 = (ulong *)((long)puVar24 + 4);
                  }
                  if ((puVar25 < (ulong *)((long)puVar6 - 1U)) &&
                     ((short)*puVar24 == (short)*puVar25)) {
                    puVar25 = (ulong *)((long)puVar25 + 2);
                    puVar24 = (ulong *)((long)puVar24 + 2);
                  }
                  if (puVar25 < puVar6) {
                    puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar24 == (char)*puVar25));
                  }
                  uVar17 = (int)puVar25 - (int)puVar33;
                }
                goto LAB_0010c465;
              }
              if (*puVar24 == *puVar33) {
                puVar24 = (ulong *)(piVar40 + 3);
                puVar25 = (ulong *)((long)puVar32 + 0xc);
                goto LAB_0010c3f5;
              }
              uVar20 = *puVar33 ^ *puVar24;
              lVar14 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                }
              }
              uVar17 = (uint)lVar14 >> 3;
LAB_0010c465:
              puVar33 = (ulong *)((long)puVar32 + (ulong)uVar17 + 4);
              if (puVar33 == puVar6) {
                puVar33 = puVar6;
                puVar24 = (ulong *)source;
                if (puVar36 <= puVar6) {
LAB_0010c49c:
                  puVar32 = (ulong *)((long)puVar32 + (lVar5 - (long)piVar40));
                  if (puVar8 <= puVar32) {
                    puVar32 = puVar8;
                  }
                  iVar10 = (int)puVar33 - (int)puVar32;
LAB_0010c4bd:
                  if (puVar33 < puVar36) {
                    if (*puVar24 == *puVar33) goto code_r0x0010c4d1;
                    uVar13 = *puVar33 ^ *puVar24;
                    uVar20 = 0;
                    if (uVar13 != 0) {
                      for (; (uVar13 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                      }
                    }
                    uVar11 = ((uint)(uVar20 >> 3) & 0x1fffffff) + iVar10;
                  }
                  else {
                    if ((puVar33 < source + ((ulong)(uint)inputSize - 8)) &&
                       ((int)*puVar24 == (int)*puVar33)) {
                      puVar33 = (ulong *)((long)puVar33 + 4);
                      puVar24 = (ulong *)((long)puVar24 + 4);
                    }
                    if ((puVar33 < source + ((ulong)(uint)inputSize - 6)) &&
                       ((short)*puVar24 == (short)*puVar33)) {
                      puVar33 = (ulong *)((long)puVar33 + 2);
                      puVar24 = (ulong *)((long)puVar24 + 2);
                    }
                    if (puVar33 < puVar8) {
                      puVar33 = (ulong *)((long)puVar33 + (ulong)((char)*puVar24 == (char)*puVar33))
                      ;
                    }
                    uVar11 = (int)puVar33 - (int)puVar6;
                  }
                  goto LAB_0010c4f6;
                }
                if (*(ulong *)source == *puVar6) {
                  puVar33 = puVar6 + 1;
                  puVar24 = (ulong *)(source + 8);
                  goto LAB_0010c49c;
                }
                uVar20 = *puVar6 ^ *(ulong *)source;
                lVar14 = 0;
                if (uVar20 != 0) {
                  for (; (uVar20 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                  }
                }
                uVar11 = (uint)lVar14 >> 3;
LAB_0010c4f6:
                uVar17 = uVar17 + uVar11;
                puVar33 = (ulong *)((long)puVar6 + (ulong)uVar11);
              }
            }
            else {
              puVar33 = (ulong *)((long)puVar32 + 4);
              puVar6 = (ulong *)(piVar40 + 1);
              puVar24 = puVar33;
              if (puVar36 <= puVar33) {
LAB_0010c386:
                iVar10 = ((int)puVar24 - (int)puVar32) + -4;
LAB_0010c393:
                if (puVar24 < puVar36) {
                  if (*puVar6 == *puVar24) goto code_r0x0010c3ab;
                  uVar13 = *puVar24 ^ *puVar6;
                  uVar20 = 0;
                  if (uVar13 != 0) {
                    for (; (uVar13 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                    }
                  }
                  uVar17 = ((uint)(uVar20 >> 3) & 0x1fffffff) + iVar10;
                }
                else {
                  if ((puVar24 < source + ((ulong)(uint)inputSize - 8)) &&
                     ((int)*puVar6 == (int)*puVar24)) {
                    puVar24 = (ulong *)((long)puVar24 + 4);
                    puVar6 = (ulong *)((long)puVar6 + 4);
                  }
                  if ((puVar24 < source + ((ulong)(uint)inputSize - 6)) &&
                     ((short)*puVar6 == (short)*puVar24)) {
                    puVar24 = (ulong *)((long)puVar24 + 2);
                    puVar6 = (ulong *)((long)puVar6 + 2);
                  }
                  if (puVar24 < puVar8) {
                    puVar24 = (ulong *)((long)puVar24 + (ulong)((char)*puVar6 == (char)*puVar24));
                  }
                  uVar17 = (int)puVar24 - (int)puVar33;
                }
                goto LAB_0010c439;
              }
              if (*puVar6 == *puVar33) {
                puVar6 = (ulong *)(piVar40 + 3);
                puVar24 = (ulong *)((long)puVar32 + 0xc);
                goto LAB_0010c386;
              }
              uVar20 = *puVar33 ^ *puVar6;
              lVar14 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
                }
              }
              uVar17 = (uint)lVar14 >> 3;
LAB_0010c439:
              puVar33 = (ulong *)((long)puVar32 + (ulong)uVar17 + 4);
            }
            iVar10 = 0;
            if (pcVar37 < (char *)((long)puVar22 + (ulong)(uVar17 + 0xf0) / 0xff + 8)) break;
            dest = (char *)((long)puVar22 + 2);
            if (uVar17 < 0xf) {
              *local_a8 = *local_a8 + (char)uVar17;
            }
            else {
              *local_a8 = *local_a8 + '\x0f';
              dest[0] = -1;
              dest[1] = -1;
              dest[2] = -1;
              dest[3] = -1;
              lVar14 = 0;
              for (uVar11 = uVar17 - 0xf; 0x3fb < uVar11; uVar11 = uVar11 - 0x3fc) {
                pcVar9 = (char *)((long)puVar22 + lVar14 + 6);
                pcVar9[0] = -1;
                pcVar9[1] = -1;
                pcVar9[2] = -1;
                pcVar9[3] = -1;
                lVar14 = lVar14 + 4;
              }
              lVar19 = lVar14 + ((ulong)uVar11 & 0xffff) / 0xff;
              dest = (char *)((long)puVar22 + lVar19 + 3);
              *(char *)((long)puVar22 + lVar19 + 2) =
                   (char)lVar14 + (char)((ushort)uVar11 / 0xff) + (char)uVar17 + -0xf;
            }
            if (source + ((ulong)(uint)inputSize - 0xb) <= puVar33) goto LAB_0010cdb9;
            *(int *)((long)LZ4_stream +
                    ((ulong)(*(long *)((long)puVar33 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
                 ((int)puVar33 + -2) - iVar21;
            uVar20 = *puVar33 * -0x30e4432345000000 >> 0x34;
            uVar17 = *(uint *)((long)LZ4_stream + uVar20 * 4);
            if (uVar17 < uVar4) {
              uVar17 = iVar18 + __src->hashTable[uVar20];
              piVar40 = (int *)((ulong)__src->hashTable[uVar20] + lVar31);
              piVar12 = piVar28;
            }
            else {
              piVar40 = (int *)((ulong)uVar17 + lVar30);
              piVar12 = (int *)source;
            }
            uVar11 = (int)puVar33 - iVar21;
            *(uint *)((long)LZ4_stream + uVar20 * 4) = uVar11;
            local_a8 = dest;
            if ((uVar17 + 0xffff < uVar11) || (*piVar40 != (int)*puVar33)) goto LAB_0010c09c;
            puVar22 = (ulong *)(dest + 1);
            *dest = '\0';
            iVar29 = uVar11 - uVar17;
            puVar32 = puVar33;
          } while( true );
        }
        goto LAB_0010cf03;
      }
LAB_0010cdb9:
      pcVar9 = source + ((ulong)(uint)inputSize - (long)puVar33);
      iVar10 = 0;
      if (pcVar37 < dest + (long)(pcVar9 + (ulong)(pcVar9 + 0xf0) / 0xff + 1)) goto LAB_0010cf03;
      if (pcVar9 < (char *)0xf) {
        *dest = (char)pcVar9 << 4;
      }
      else {
        *dest = -0x10;
        for (pcVar37 = pcVar9 + -0xf; dest = dest + 1, (char *)0xfe < pcVar37;
            pcVar37 = pcVar37 + -0xff) {
          *dest = -1;
        }
        *dest = (char)pcVar37;
      }
LAB_0010cef0:
      pcVar37 = dest + 1;
      iVar10 = (int)pcVar37;
      goto LAB_0010cef3;
    }
  }
LAB_0010cd0c:
  iVar10 = 0;
  if (0 < maxOutputSize) {
    *dest = '\0';
    iVar10 = 1;
  }
LAB_0010cf03:
  (LZ4_stream->internal_donotuse).dictionary = (LZ4_byte *)source;
  (LZ4_stream->internal_donotuse).dictSize = inputSize;
  return iVar10;
code_r0x0010b753:
  puVar36 = puVar36 + 1;
  puVar8 = puVar8 + 1;
  iVar10 = iVar10 + 8;
  goto LAB_0010b73f;
code_r0x0010b35b:
  puVar36 = puVar36 + 1;
  puVar8 = puVar8 + 1;
  iVar10 = iVar10 + 8;
  goto LAB_0010b347;
LAB_0010ba50:
  lVar14 = lVar14 + (ulong)uVar26;
  piVar16 = (int *)source;
  if (uVar26 < uVar17) {
    piVar16 = piVar28;
  }
  iVar27 = uVar38 - uVar26;
  lVar19 = 0;
  cVar2 = (char)puVar6 * '\x10' + (char)puVar33 * -0x10;
  do {
    cVar3 = cVar2;
    lVar15 = lVar19;
    piVar12 = (int *)(lVar14 + lVar15);
    puVar32 = (ulong *)((long)puVar6 + lVar15);
    if ((piVar12 <= piVar16) || (puVar32 <= puVar33)) break;
    lVar19 = lVar15 + -1;
    cVar2 = cVar3 + -0x10;
  } while (*(char *)((long)puVar6 + lVar15 + -1) == *(char *)(lVar14 + -1 + lVar15));
  uVar11 = iVar18 - (int)puVar33;
  uVar20 = (ulong)((int)lVar15 + uVar11);
  uVar13 = (ulong)uVar11 + lVar15;
  iVar10 = 0;
  if (local_88 + (uVar13 & 0xffffffff) / 0xff + uVar20 + 9 <= pcVar37) {
    if ((uint)uVar13 < 0xf) {
      puVar6 = (ulong *)(local_88 + 1);
      *local_88 = cVar3;
    }
    else {
      *local_88 = -0x10;
      puVar6 = (ulong *)(local_88 + 2);
      for (iVar10 = (iVar18 - (int)puVar33) + (int)lVar15 + -0xf; 0xfe < iVar10;
          iVar10 = iVar10 + -0xff) {
        *(char *)((long)puVar6 + -1) = -1;
        puVar6 = (ulong *)((long)puVar6 + 1);
      }
      *(char *)((long)puVar6 + -1) = (char)iVar10;
    }
    puVar22 = (ulong *)(uVar20 + (long)puVar6);
    do {
      *puVar6 = *puVar33;
      puVar6 = puVar6 + 1;
      puVar33 = puVar33 + 1;
    } while (puVar6 < puVar22);
    do {
      *(short *)puVar22 = (short)iVar27;
      if (piVar16 == piVar28) {
        puVar6 = (ulong *)((lVar5 - (long)piVar12) + (long)puVar32);
        if (puVar36 < puVar6) {
          puVar6 = puVar36;
        }
        puVar33 = (ulong *)((long)puVar32 + 4);
        puVar24 = (ulong *)(piVar12 + 1);
        puVar25 = puVar33;
        if ((ulong *)((long)puVar6 - 7U) <= puVar33) {
LAB_0010bcfa:
          iVar10 = ((int)puVar25 - (int)puVar32) + -4;
LAB_0010bd04:
          if (puVar25 < (ulong *)((long)puVar6 - 7U)) {
            if (*puVar24 == *puVar25) goto code_r0x0010bd18;
            uVar13 = *puVar25 ^ *puVar24;
            uVar20 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
              }
            }
            uVar11 = ((uint)(uVar20 >> 3) & 0x1fffffff) + iVar10;
          }
          else {
            if ((puVar25 < (ulong *)((long)puVar6 - 3U)) && ((int)*puVar24 == (int)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 4);
              puVar24 = (ulong *)((long)puVar24 + 4);
            }
            if ((puVar25 < (ulong *)((long)puVar6 - 1U)) && ((short)*puVar24 == (short)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 2);
              puVar24 = (ulong *)((long)puVar24 + 2);
            }
            if (puVar25 < puVar6) {
              puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar24 == (char)*puVar25));
            }
            uVar11 = (int)puVar25 - (int)puVar33;
          }
          goto LAB_0010bd65;
        }
        if (*puVar24 == *puVar33) {
          puVar24 = (ulong *)(piVar12 + 3);
          puVar25 = (ulong *)((long)puVar32 + 0xc);
          goto LAB_0010bcfa;
        }
        uVar20 = *puVar33 ^ *puVar24;
        lVar14 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
          }
        }
        uVar11 = (uint)lVar14 >> 3;
LAB_0010bd65:
        puVar33 = (ulong *)((long)puVar32 + (ulong)uVar11 + 4);
        if (puVar33 == puVar6) {
          puVar33 = puVar6;
          puVar24 = (ulong *)source;
          if (puVar8 <= puVar6) {
LAB_0010bda4:
            puVar32 = (ulong *)((long)puVar32 + (lVar5 - (long)piVar12));
            if (puVar36 <= puVar32) {
              puVar32 = puVar36;
            }
            iVar10 = (int)puVar33 - (int)puVar32;
LAB_0010bdbd:
            if (puVar33 < puVar8) {
              if (*puVar24 == *puVar33) goto code_r0x0010bdd1;
              uVar13 = *puVar33 ^ *puVar24;
              uVar20 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                }
              }
              uVar26 = ((uint)(uVar20 >> 3) & 0x1fffffff) + iVar10;
            }
            else {
              if ((puVar33 < source + ((ulong)(uint)inputSize - 8)) &&
                 ((int)*puVar24 == (int)*puVar33)) {
                puVar33 = (ulong *)((long)puVar33 + 4);
                puVar24 = (ulong *)((long)puVar24 + 4);
              }
              if ((puVar33 < source + ((ulong)(uint)inputSize - 6)) &&
                 ((short)*puVar24 == (short)*puVar33)) {
                puVar33 = (ulong *)((long)puVar33 + 2);
                puVar24 = (ulong *)((long)puVar24 + 2);
              }
              if (puVar33 < puVar36) {
                puVar33 = (ulong *)((long)puVar33 + (ulong)((char)*puVar24 == (char)*puVar33));
              }
              uVar26 = (int)puVar33 - (int)puVar6;
            }
            goto LAB_0010bdf6;
          }
          if (*(ulong *)source == *puVar6) {
            puVar33 = puVar6 + 1;
            puVar24 = (ulong *)(source + 8);
            goto LAB_0010bda4;
          }
          uVar20 = *puVar6 ^ *(ulong *)source;
          lVar14 = 0;
          if (uVar20 != 0) {
            for (; (uVar20 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
          uVar26 = (uint)lVar14 >> 3;
LAB_0010bdf6:
          uVar11 = uVar11 + uVar26;
          puVar33 = (ulong *)((long)puVar6 + (ulong)uVar26);
        }
      }
      else {
        puVar33 = (ulong *)((long)puVar32 + 4);
        puVar6 = (ulong *)(piVar12 + 1);
        puVar24 = puVar33;
        if (puVar8 <= puVar33) {
LAB_0010bc8e:
          iVar10 = ((int)puVar24 - (int)puVar32) + -4;
LAB_0010bc96:
          if (puVar24 < puVar8) {
            if (*puVar6 == *puVar24) goto code_r0x0010bcae;
            uVar13 = *puVar24 ^ *puVar6;
            uVar20 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
              }
            }
            uVar11 = ((uint)(uVar20 >> 3) & 0x1fffffff) + iVar10;
          }
          else {
            if ((puVar24 < source + ((ulong)(uint)inputSize - 8)) && ((int)*puVar6 == (int)*puVar24)
               ) {
              puVar24 = (ulong *)((long)puVar24 + 4);
              puVar6 = (ulong *)((long)puVar6 + 4);
            }
            if ((puVar24 < source + ((ulong)(uint)inputSize - 6)) &&
               ((short)*puVar6 == (short)*puVar24)) {
              puVar24 = (ulong *)((long)puVar24 + 2);
              puVar6 = (ulong *)((long)puVar6 + 2);
            }
            if (puVar24 < puVar36) {
              puVar24 = (ulong *)((long)puVar24 + (ulong)((char)*puVar6 == (char)*puVar24));
            }
            uVar11 = (int)puVar24 - (int)puVar33;
          }
          goto LAB_0010bd3e;
        }
        if (*puVar6 == *puVar33) {
          puVar6 = (ulong *)(piVar12 + 3);
          puVar24 = (ulong *)((long)puVar32 + 0xc);
          goto LAB_0010bc8e;
        }
        uVar20 = *puVar33 ^ *puVar6;
        lVar14 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
          }
        }
        uVar11 = (uint)lVar14 >> 3;
LAB_0010bd3e:
        puVar33 = (ulong *)((long)puVar32 + (ulong)uVar11 + 4);
      }
      iVar10 = 0;
      if (pcVar37 < (char *)((long)puVar22 + (ulong)(uVar11 + 0xf0) / 0xff + 8)) break;
      dest = (char *)((long)puVar22 + 2);
      if (uVar11 < 0xf) {
        *local_88 = *local_88 + (char)uVar11;
      }
      else {
        *local_88 = *local_88 + '\x0f';
        dest[0] = -1;
        dest[1] = -1;
        dest[2] = -1;
        dest[3] = -1;
        lVar14 = 0;
        for (uVar26 = uVar11 - 0xf; 0x3fb < uVar26; uVar26 = uVar26 - 0x3fc) {
          pcVar9 = (char *)((long)puVar22 + lVar14 + 6);
          pcVar9[0] = -1;
          pcVar9[1] = -1;
          pcVar9[2] = -1;
          pcVar9[3] = -1;
          lVar14 = lVar14 + 4;
        }
        lVar19 = lVar14 + ((ulong)uVar26 & 0xffff) / 0xff;
        dest = (char *)((long)puVar22 + lVar19 + 3);
        *(char *)((long)puVar22 + lVar19 + 2) =
             (char)lVar14 + (char)((uVar26 & 0xffff) / 0xff) + (char)uVar11 + -0xf;
      }
      if (source + ((ulong)(uint)inputSize - 0xb) <= puVar33) goto LAB_0010cfb2;
      *(int *)((long)LZ4_stream +
              ((ulong)(*(long *)((long)puVar33 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)puVar33 + -2) - iVar21;
      uVar20 = *puVar33 * -0x30e4432345000000 >> 0x34;
      uVar26 = (int)puVar33 - iVar21;
      uVar11 = *(uint *)((long)LZ4_stream + uVar20 * 4);
      piVar16 = (int *)source;
      lVar14 = lVar30;
      if (uVar11 < uVar17) {
        piVar16 = piVar28;
        lVar14 = lVar31;
      }
      piVar12 = (int *)(lVar14 + (ulong)uVar11);
      *(uint *)((long)LZ4_stream + uVar20 * 4) = uVar26;
      local_88 = dest;
      if (((uVar11 < uVar17 - uVar4) || (uVar11 + 0xffff < uVar26)) || (*piVar12 != (int)*puVar33))
      goto LAB_0010b9d9;
      puVar22 = (ulong *)(dest + 1);
      *dest = '\0';
      iVar27 = uVar26 - uVar11;
      puVar32 = puVar33;
    } while( true );
  }
  goto LAB_0010cf03;
code_r0x0010bd18:
  puVar25 = puVar25 + 1;
  puVar24 = puVar24 + 1;
  iVar10 = iVar10 + 8;
  goto LAB_0010bd04;
code_r0x0010bdd1:
  puVar33 = puVar33 + 1;
  puVar24 = puVar24 + 1;
  iVar10 = iVar10 + 8;
  goto LAB_0010bdbd;
code_r0x0010bcae:
  puVar24 = puVar24 + 1;
  puVar6 = puVar6 + 1;
  iVar10 = iVar10 + 8;
  goto LAB_0010bc96;
LAB_0010c7ca:
  lVar14 = lVar14 + (ulong)uVar11;
  piVar16 = (int *)source;
  if (uVar11 < uVar17) {
    piVar16 = piVar28;
  }
  iVar27 = uVar26 - uVar11;
  lVar19 = 0;
  cVar2 = (char)puVar6 * '\x10' + (char)puVar33 * -0x10;
  do {
    cVar3 = cVar2;
    lVar15 = lVar19;
    piVar12 = (int *)(lVar14 + lVar15);
    puVar32 = (ulong *)((long)puVar6 + lVar15);
    if ((piVar12 <= piVar16) || (puVar32 <= puVar33)) break;
    lVar19 = lVar15 + -1;
    cVar2 = cVar3 + -0x10;
  } while (*(char *)((long)puVar6 + lVar15 + -1) == *(char *)(lVar14 + -1 + lVar15));
  uVar4 = iVar18 - (int)puVar33;
  uVar13 = (ulong)(uVar4 + (int)lVar15);
  uVar20 = (ulong)uVar4 + lVar15;
  iVar10 = 0;
  if (local_a8 + (uVar20 & 0xffffffff) / 0xff + uVar13 + 9 <= pcVar37) {
    if ((uint)uVar20 < 0xf) {
      puVar6 = (ulong *)(local_a8 + 1);
      *local_a8 = cVar3;
    }
    else {
      *local_a8 = -0x10;
      puVar6 = (ulong *)(local_a8 + 2);
      for (iVar10 = (iVar18 - (int)puVar33) + (int)lVar15 + -0xf; 0xfe < iVar10;
          iVar10 = iVar10 + -0xff) {
        *(char *)((long)puVar6 + -1) = -1;
        puVar6 = (ulong *)((long)puVar6 + 1);
      }
      *(char *)((long)puVar6 + -1) = (char)iVar10;
    }
    puVar22 = (ulong *)(uVar13 + (long)puVar6);
    do {
      *puVar6 = *puVar33;
      puVar6 = puVar6 + 1;
      puVar33 = puVar33 + 1;
    } while (puVar6 < puVar22);
    do {
      *(short *)puVar22 = (short)iVar27;
      if (piVar16 == piVar28) {
        puVar6 = (ulong *)((lVar5 - (long)piVar12) + (long)puVar32);
        if (puVar36 < puVar6) {
          puVar6 = puVar36;
        }
        puVar33 = (ulong *)((long)puVar32 + 4);
        puVar24 = (ulong *)(piVar12 + 1);
        puVar25 = puVar33;
        if ((ulong *)((long)puVar6 - 7U) <= puVar33) {
LAB_0010ca54:
          iVar10 = ((int)puVar25 - (int)puVar32) + -4;
LAB_0010ca5e:
          if (puVar25 < (ulong *)((long)puVar6 - 7U)) {
            if (*puVar24 == *puVar25) goto code_r0x0010ca72;
            uVar13 = *puVar25 ^ *puVar24;
            uVar20 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
              }
            }
            uVar4 = ((uint)(uVar20 >> 3) & 0x1fffffff) + iVar10;
          }
          else {
            if ((puVar25 < (ulong *)((long)puVar6 - 3U)) && ((int)*puVar24 == (int)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 4);
              puVar24 = (ulong *)((long)puVar24 + 4);
            }
            if ((puVar25 < (ulong *)((long)puVar6 - 1U)) && ((short)*puVar24 == (short)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 2);
              puVar24 = (ulong *)((long)puVar24 + 2);
            }
            if (puVar25 < puVar6) {
              puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar24 == (char)*puVar25));
            }
            uVar4 = (int)puVar25 - (int)puVar33;
          }
          goto LAB_0010cabf;
        }
        if (*puVar24 == *puVar33) {
          puVar24 = (ulong *)(piVar12 + 3);
          puVar25 = (ulong *)((long)puVar32 + 0xc);
          goto LAB_0010ca54;
        }
        uVar20 = *puVar33 ^ *puVar24;
        lVar14 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
          }
        }
        uVar4 = (uint)lVar14 >> 3;
LAB_0010cabf:
        puVar33 = (ulong *)((long)puVar32 + (ulong)uVar4 + 4);
        if (puVar33 == puVar6) {
          puVar33 = puVar6;
          puVar24 = (ulong *)source;
          if (puVar8 <= puVar6) {
LAB_0010cafb:
            puVar32 = (ulong *)((long)puVar32 + (lVar5 - (long)piVar12));
            if (puVar36 <= puVar32) {
              puVar32 = puVar36;
            }
            iVar10 = (int)puVar33 - (int)puVar32;
LAB_0010cb14:
            if (puVar33 < puVar8) {
              if (*puVar24 == *puVar33) goto code_r0x0010cb28;
              uVar13 = *puVar33 ^ *puVar24;
              uVar20 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                }
              }
              uVar11 = ((uint)(uVar20 >> 3) & 0x1fffffff) + iVar10;
            }
            else {
              if ((puVar33 < source + ((ulong)(uint)inputSize - 8)) &&
                 ((int)*puVar24 == (int)*puVar33)) {
                puVar33 = (ulong *)((long)puVar33 + 4);
                puVar24 = (ulong *)((long)puVar24 + 4);
              }
              if ((puVar33 < source + ((ulong)(uint)inputSize - 6)) &&
                 ((short)*puVar24 == (short)*puVar33)) {
                puVar33 = (ulong *)((long)puVar33 + 2);
                puVar24 = (ulong *)((long)puVar24 + 2);
              }
              if (puVar33 < puVar36) {
                puVar33 = (ulong *)((long)puVar33 + (ulong)((char)*puVar24 == (char)*puVar33));
              }
              uVar11 = (int)puVar33 - (int)puVar6;
            }
            goto LAB_0010cb4d;
          }
          if (*(ulong *)source == *puVar6) {
            puVar33 = puVar6 + 1;
            puVar24 = (ulong *)(source + 8);
            goto LAB_0010cafb;
          }
          uVar20 = *puVar6 ^ *(ulong *)source;
          lVar14 = 0;
          if (uVar20 != 0) {
            for (; (uVar20 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
          uVar11 = (uint)lVar14 >> 3;
LAB_0010cb4d:
          uVar4 = uVar4 + uVar11;
          puVar33 = (ulong *)((long)puVar6 + (ulong)uVar11);
        }
      }
      else {
        puVar33 = (ulong *)((long)puVar32 + 4);
        puVar6 = (ulong *)(piVar12 + 1);
        puVar24 = puVar33;
        if (puVar8 <= puVar33) {
LAB_0010c9e8:
          iVar10 = ((int)puVar24 - (int)puVar32) + -4;
LAB_0010c9f0:
          if (puVar24 < puVar8) {
            if (*puVar6 == *puVar24) goto code_r0x0010ca08;
            uVar13 = *puVar24 ^ *puVar6;
            uVar20 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
              }
            }
            uVar4 = ((uint)(uVar20 >> 3) & 0x1fffffff) + iVar10;
          }
          else {
            if ((puVar24 < source + ((ulong)(uint)inputSize - 8)) && ((int)*puVar6 == (int)*puVar24)
               ) {
              puVar24 = (ulong *)((long)puVar24 + 4);
              puVar6 = (ulong *)((long)puVar6 + 4);
            }
            if ((puVar24 < source + ((ulong)(uint)inputSize - 6)) &&
               ((short)*puVar6 == (short)*puVar24)) {
              puVar24 = (ulong *)((long)puVar24 + 2);
              puVar6 = (ulong *)((long)puVar6 + 2);
            }
            if (puVar24 < puVar36) {
              puVar24 = (ulong *)((long)puVar24 + (ulong)((char)*puVar6 == (char)*puVar24));
            }
            uVar4 = (int)puVar24 - (int)puVar33;
          }
          goto LAB_0010ca98;
        }
        if (*puVar6 == *puVar33) {
          puVar6 = (ulong *)(piVar12 + 3);
          puVar24 = (ulong *)((long)puVar32 + 0xc);
          goto LAB_0010c9e8;
        }
        uVar20 = *puVar33 ^ *puVar6;
        lVar14 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
          }
        }
        uVar4 = (uint)lVar14 >> 3;
LAB_0010ca98:
        puVar33 = (ulong *)((long)puVar32 + (ulong)uVar4 + 4);
      }
      iVar10 = 0;
      if (pcVar37 < (char *)((long)puVar22 + (ulong)(uVar4 + 0xf0) / 0xff + 8)) break;
      dest = (char *)((long)puVar22 + 2);
      if (uVar4 < 0xf) {
        *local_a8 = *local_a8 + (char)uVar4;
      }
      else {
        *local_a8 = *local_a8 + '\x0f';
        dest[0] = -1;
        dest[1] = -1;
        dest[2] = -1;
        dest[3] = -1;
        lVar14 = 0;
        for (uVar11 = uVar4 - 0xf; 0x3fb < uVar11; uVar11 = uVar11 - 0x3fc) {
          pcVar9 = (char *)((long)puVar22 + lVar14 + 6);
          pcVar9[0] = -1;
          pcVar9[1] = -1;
          pcVar9[2] = -1;
          pcVar9[3] = -1;
          lVar14 = lVar14 + 4;
        }
        lVar19 = lVar14 + ((ulong)uVar11 & 0xffff) / 0xff;
        dest = (char *)((long)puVar22 + lVar19 + 3);
        *(char *)((long)puVar22 + lVar19 + 2) =
             (char)lVar14 + (char)((uVar11 & 0xffff) / 0xff) + (char)uVar4 + -0xf;
      }
      if (source + ((ulong)(uint)inputSize - 0xb) <= puVar33) goto LAB_0010ce28;
      *(int *)((long)LZ4_stream +
              ((ulong)(*(long *)((long)puVar33 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)puVar33 + -2) - iVar21;
      uVar20 = *puVar33 * -0x30e4432345000000 >> 0x34;
      uVar11 = (int)puVar33 - iVar21;
      uVar4 = *(uint *)((long)LZ4_stream + uVar20 * 4);
      piVar16 = (int *)source;
      lVar14 = lVar30;
      if (uVar4 < uVar17) {
        piVar16 = piVar28;
        lVar14 = lVar31;
      }
      piVar12 = (int *)(lVar14 + (ulong)uVar4);
      *(uint *)((long)LZ4_stream + uVar20 * 4) = uVar11;
      local_a8 = dest;
      if ((uVar4 + 0xffff < uVar11) || (*piVar12 != (int)*puVar33)) goto LAB_0010c767;
      puVar22 = (ulong *)(dest + 1);
      *dest = '\0';
      iVar27 = uVar11 - uVar4;
      puVar32 = puVar33;
    } while( true );
  }
  goto LAB_0010cf03;
code_r0x0010ca72:
  puVar25 = puVar25 + 1;
  puVar24 = puVar24 + 1;
  iVar10 = iVar10 + 8;
  goto LAB_0010ca5e;
code_r0x0010cb28:
  puVar33 = puVar33 + 1;
  puVar24 = puVar24 + 1;
  iVar10 = iVar10 + 8;
  goto LAB_0010cb14;
code_r0x0010ca08:
  puVar24 = puVar24 + 1;
  puVar6 = puVar6 + 1;
  iVar10 = iVar10 + 8;
  goto LAB_0010c9f0;
LAB_0010aba0:
  lVar14 = lVar14 + (ulong)uVar11;
  piVar16 = (int *)source;
  if (uVar11 < uVar4) {
    piVar16 = piVar28;
  }
  iVar27 = uVar26 - uVar11;
  lVar19 = 0;
  cVar2 = (char)puVar6 * '\x10' + (char)puVar33 * -0x10;
  do {
    cVar3 = cVar2;
    lVar15 = lVar19;
    piVar12 = (int *)(lVar14 + lVar15);
    puVar32 = (ulong *)((long)puVar6 + lVar15);
    if ((piVar12 <= piVar16) || (puVar32 <= puVar33)) break;
    lVar19 = lVar15 + -1;
    cVar2 = cVar3 + -0x10;
  } while (*(char *)((long)puVar6 + lVar15 + -1) == *(char *)(lVar14 + -1 + lVar15));
  uVar17 = iVar18 - (int)puVar33;
  uVar13 = (ulong)(uVar17 + (int)lVar15);
  uVar20 = (ulong)uVar17 + lVar15;
  iVar10 = 0;
  if (local_b0 + (uVar20 & 0xffffffff) / 0xff + uVar13 + 9 <= pcVar37) {
    if ((uint)uVar20 < 0xf) {
      puVar6 = (ulong *)(local_b0 + 1);
      *local_b0 = cVar3;
    }
    else {
      *local_b0 = -0x10;
      puVar6 = (ulong *)(local_b0 + 2);
      for (iVar10 = (iVar18 - (int)puVar33) + (int)lVar15 + -0xf; 0xfe < iVar10;
          iVar10 = iVar10 + -0xff) {
        *(char *)((long)puVar6 + -1) = -1;
        puVar6 = (ulong *)((long)puVar6 + 1);
      }
      *(char *)((long)puVar6 + -1) = (char)iVar10;
    }
    puVar22 = (ulong *)(uVar13 + (long)puVar6);
    do {
      *puVar6 = *puVar33;
      puVar6 = puVar6 + 1;
      puVar33 = puVar33 + 1;
    } while (puVar6 < puVar22);
    do {
      *(short *)puVar22 = (short)iVar27;
      if (piVar16 == piVar28) {
        puVar6 = (ulong *)((lVar31 - (long)piVar12) + (long)puVar32);
        if (puVar8 < puVar6) {
          puVar6 = puVar8;
        }
        puVar33 = (ulong *)((long)puVar32 + 4);
        puVar24 = (ulong *)(piVar12 + 1);
        puVar25 = puVar33;
        if ((ulong *)((long)puVar6 - 7U) <= puVar33) {
LAB_0010ae34:
          iVar10 = ((int)puVar25 - (int)puVar32) + -4;
LAB_0010ae3e:
          if (puVar25 < (ulong *)((long)puVar6 - 7U)) {
            if (*puVar24 == *puVar25) goto code_r0x0010ae52;
            uVar13 = *puVar25 ^ *puVar24;
            uVar20 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
              }
            }
            uVar17 = ((uint)(uVar20 >> 3) & 0x1fffffff) + iVar10;
          }
          else {
            if ((puVar25 < (ulong *)((long)puVar6 - 3U)) && ((int)*puVar24 == (int)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 4);
              puVar24 = (ulong *)((long)puVar24 + 4);
            }
            if ((puVar25 < (ulong *)((long)puVar6 - 1U)) && ((short)*puVar24 == (short)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 2);
              puVar24 = (ulong *)((long)puVar24 + 2);
            }
            if (puVar25 < puVar6) {
              puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar24 == (char)*puVar25));
            }
            uVar17 = (int)puVar25 - (int)puVar33;
          }
          goto LAB_0010ae9f;
        }
        if (*puVar24 == *puVar33) {
          puVar24 = (ulong *)(piVar12 + 3);
          puVar25 = (ulong *)((long)puVar32 + 0xc);
          goto LAB_0010ae34;
        }
        uVar20 = *puVar33 ^ *puVar24;
        lVar14 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
          }
        }
        uVar17 = (uint)lVar14 >> 3;
LAB_0010ae9f:
        puVar33 = (ulong *)((long)puVar32 + (ulong)uVar17 + 4);
        if (puVar33 == puVar6) {
          puVar33 = puVar6;
          puVar24 = (ulong *)source;
          if (puVar36 <= puVar6) {
LAB_0010aedb:
            puVar32 = (ulong *)((long)puVar32 + (lVar31 - (long)piVar12));
            if (puVar8 <= puVar32) {
              puVar32 = puVar8;
            }
            iVar10 = (int)puVar33 - (int)puVar32;
LAB_0010aef4:
            if (puVar33 < puVar36) {
              if (*puVar24 == *puVar33) goto code_r0x0010af08;
              uVar13 = *puVar33 ^ *puVar24;
              uVar20 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                }
              }
              uVar11 = ((uint)(uVar20 >> 3) & 0x1fffffff) + iVar10;
            }
            else {
              if ((puVar33 < source + ((ulong)(uint)inputSize - 8)) &&
                 ((int)*puVar24 == (int)*puVar33)) {
                puVar33 = (ulong *)((long)puVar33 + 4);
                puVar24 = (ulong *)((long)puVar24 + 4);
              }
              if ((puVar33 < source + ((ulong)(uint)inputSize - 6)) &&
                 ((short)*puVar24 == (short)*puVar33)) {
                puVar33 = (ulong *)((long)puVar33 + 2);
                puVar24 = (ulong *)((long)puVar24 + 2);
              }
              if (puVar33 < puVar8) {
                puVar33 = (ulong *)((long)puVar33 + (ulong)((char)*puVar24 == (char)*puVar33));
              }
              uVar11 = (int)puVar33 - (int)puVar6;
            }
            goto LAB_0010af2d;
          }
          if (*(ulong *)source == *puVar6) {
            puVar33 = puVar6 + 1;
            puVar24 = (ulong *)(source + 8);
            goto LAB_0010aedb;
          }
          uVar20 = *puVar6 ^ *(ulong *)source;
          lVar14 = 0;
          if (uVar20 != 0) {
            for (; (uVar20 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
          uVar11 = (uint)lVar14 >> 3;
LAB_0010af2d:
          uVar17 = uVar17 + uVar11;
          puVar33 = (ulong *)((long)puVar6 + (ulong)uVar11);
        }
      }
      else {
        puVar33 = (ulong *)((long)puVar32 + 4);
        puVar6 = (ulong *)(piVar12 + 1);
        puVar24 = puVar33;
        if (puVar36 <= puVar33) {
LAB_0010adc8:
          iVar10 = ((int)puVar24 - (int)puVar32) + -4;
LAB_0010add0:
          if (puVar24 < puVar36) {
            if (*puVar6 == *puVar24) goto code_r0x0010ade8;
            uVar13 = *puVar24 ^ *puVar6;
            uVar20 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
              }
            }
            uVar17 = ((uint)(uVar20 >> 3) & 0x1fffffff) + iVar10;
          }
          else {
            if ((puVar24 < source + ((ulong)(uint)inputSize - 8)) && ((int)*puVar6 == (int)*puVar24)
               ) {
              puVar24 = (ulong *)((long)puVar24 + 4);
              puVar6 = (ulong *)((long)puVar6 + 4);
            }
            if ((puVar24 < source + ((ulong)(uint)inputSize - 6)) &&
               ((short)*puVar6 == (short)*puVar24)) {
              puVar24 = (ulong *)((long)puVar24 + 2);
              puVar6 = (ulong *)((long)puVar6 + 2);
            }
            if (puVar24 < puVar8) {
              puVar24 = (ulong *)((long)puVar24 + (ulong)((char)*puVar6 == (char)*puVar24));
            }
            uVar17 = (int)puVar24 - (int)puVar33;
          }
          goto LAB_0010ae78;
        }
        if (*puVar6 == *puVar33) {
          puVar6 = (ulong *)(piVar12 + 3);
          puVar24 = (ulong *)((long)puVar32 + 0xc);
          goto LAB_0010adc8;
        }
        uVar20 = *puVar33 ^ *puVar6;
        lVar14 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
          }
        }
        uVar17 = (uint)lVar14 >> 3;
LAB_0010ae78:
        puVar33 = (ulong *)((long)puVar32 + (ulong)uVar17 + 4);
      }
      iVar10 = 0;
      if (pcVar37 < (char *)((long)puVar22 + (ulong)(uVar17 + 0xf0) / 0xff + 8)) break;
      dest = (char *)((long)puVar22 + 2);
      if (uVar17 < 0xf) {
        *local_b0 = *local_b0 + (char)uVar17;
      }
      else {
        *local_b0 = *local_b0 + '\x0f';
        dest[0] = -1;
        dest[1] = -1;
        dest[2] = -1;
        dest[3] = -1;
        lVar14 = 0;
        for (uVar11 = uVar17 - 0xf; 0x3fb < uVar11; uVar11 = uVar11 - 0x3fc) {
          pcVar9 = (char *)((long)puVar22 + lVar14 + 6);
          pcVar9[0] = -1;
          pcVar9[1] = -1;
          pcVar9[2] = -1;
          pcVar9[3] = -1;
          lVar14 = lVar14 + 4;
        }
        lVar19 = lVar14 + ((ulong)uVar11 & 0xffff) / 0xff;
        dest = (char *)((long)puVar22 + lVar19 + 3);
        *(char *)((long)puVar22 + lVar19 + 2) =
             (char)lVar14 + (char)((uVar11 & 0xffff) / 0xff) + (char)uVar17 + -0xf;
      }
      if (source + ((ulong)(uint)inputSize - 0xb) <= puVar33) goto LAB_0010cca8;
      *(int *)((long)LZ4_stream +
              ((ulong)(*(long *)((long)puVar33 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)puVar33 + -2) - iVar21;
      uVar20 = *puVar33 * -0x30e4432345000000 >> 0x34;
      uVar11 = (int)puVar33 - iVar21;
      uVar17 = *(uint *)((long)LZ4_stream + uVar20 * 4);
      piVar16 = (int *)source;
      lVar14 = lVar30;
      if (uVar17 < uVar4) {
        piVar16 = piVar28;
        lVar14 = lVar5;
      }
      piVar12 = (int *)(lVar14 + (ulong)uVar17);
      *(uint *)((long)LZ4_stream + uVar20 * 4) = uVar11;
      local_b0 = dest;
      if ((uVar17 + 0xffff < uVar11) || (*piVar12 != (int)*puVar33)) goto LAB_0010ab31;
      puVar22 = (ulong *)(dest + 1);
      *dest = '\0';
      iVar27 = uVar11 - uVar17;
      puVar32 = puVar33;
    } while( true );
  }
  goto LAB_0010cf03;
code_r0x0010ae52:
  puVar25 = puVar25 + 1;
  puVar24 = puVar24 + 1;
  iVar10 = iVar10 + 8;
  goto LAB_0010ae3e;
code_r0x0010af08:
  puVar33 = puVar33 + 1;
  puVar24 = puVar24 + 1;
  iVar10 = iVar10 + 8;
  goto LAB_0010aef4;
code_r0x0010ade8:
  puVar24 = puVar24 + 1;
  puVar6 = puVar6 + 1;
  iVar10 = iVar10 + 8;
  goto LAB_0010add0;
LAB_0010cca8:
  pcVar9 = source + ((ulong)(uint)inputSize - (long)puVar33);
  iVar10 = 0;
  if (pcVar37 < dest + (long)(pcVar9 + (ulong)(pcVar9 + 0xf0) / 0xff + 1)) goto LAB_0010cf03;
  if (pcVar9 < (char *)0xf) {
    *dest = (char)pcVar9 << 4;
  }
  else {
    *dest = -0x10;
    for (pcVar37 = pcVar9 + -0xf; dest = dest + 1, (char *)0xfe < pcVar37; pcVar37 = pcVar37 + -0xff
        ) {
      *dest = -1;
    }
    *dest = (char)pcVar37;
  }
LAB_0010ce93:
  pcVar37 = dest + 1;
  iVar10 = (int)pcVar37;
LAB_0010cef3:
  memcpy(pcVar37,puVar33,(size_t)pcVar9);
  iVar10 = (iVar10 + (int)pcVar9) - local_90;
  goto LAB_0010cf03;
code_r0x0010c413:
  puVar25 = puVar25 + 1;
  puVar24 = puVar24 + 1;
  iVar10 = iVar10 + 8;
  goto LAB_0010c3ff;
code_r0x0010c4d1:
  puVar33 = puVar33 + 1;
  puVar24 = puVar24 + 1;
  iVar10 = iVar10 + 8;
  goto LAB_0010c4bd;
code_r0x0010c3ab:
  puVar24 = puVar24 + 1;
  puVar6 = puVar6 + 1;
  iVar10 = iVar10 + 8;
  goto LAB_0010c393;
}

Assistant:

int LZ4_compress_fast_continue (LZ4_stream_t* LZ4_stream,
                                const char* source, char* dest,
                                int inputSize, int maxOutputSize,
                                int acceleration)
{
    const tableType_t tableType = byU32;
    LZ4_stream_t_internal* streamPtr = &LZ4_stream->internal_donotuse;
    const BYTE* dictEnd = streamPtr->dictionary + streamPtr->dictSize;

    DEBUGLOG(5, "LZ4_compress_fast_continue (inputSize=%i)", inputSize);

    LZ4_renormDictT(streamPtr, inputSize);   /* avoid index overflow */
    if (acceleration < 1) acceleration = LZ4_ACCELERATION_DEFAULT;
    if (acceleration > LZ4_ACCELERATION_MAX) acceleration = LZ4_ACCELERATION_MAX;

    /* invalidate tiny dictionaries */
    if ( (streamPtr->dictSize-1 < 4-1)   /* intentional underflow */
      && (dictEnd != (const BYTE*)source) ) {
        DEBUGLOG(5, "LZ4_compress_fast_continue: dictSize(%u) at addr:%p is too small", streamPtr->dictSize, streamPtr->dictionary);
        streamPtr->dictSize = 0;
        streamPtr->dictionary = (const BYTE*)source;
        dictEnd = (const BYTE*)source;
    }

    /* Check overlapping input/dictionary space */
    {   const BYTE* sourceEnd = (const BYTE*) source + inputSize;
        if ((sourceEnd > streamPtr->dictionary) && (sourceEnd < dictEnd)) {
            streamPtr->dictSize = (U32)(dictEnd - sourceEnd);
            if (streamPtr->dictSize > 64 KB) streamPtr->dictSize = 64 KB;
            if (streamPtr->dictSize < 4) streamPtr->dictSize = 0;
            streamPtr->dictionary = dictEnd - streamPtr->dictSize;
        }
    }

    /* prefix mode : source data follows dictionary */
    if (dictEnd == (const BYTE*)source) {
        if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset))
            return LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, withPrefix64k, dictSmall, acceleration);
        else
            return LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, withPrefix64k, noDictIssue, acceleration);
    }

    /* external dictionary mode */
    {   int result;
        if (streamPtr->dictCtx) {
            /* We depend here on the fact that dictCtx'es (produced by
             * LZ4_loadDict) guarantee that their tables contain no references
             * to offsets between dictCtx->currentOffset - 64 KB and
             * dictCtx->currentOffset - dictCtx->dictSize. This makes it safe
             * to use noDictIssue even when the dict isn't a full 64 KB.
             */
            if (inputSize > 4 KB) {
                /* For compressing large blobs, it is faster to pay the setup
                 * cost to copy the dictionary's tables into the active context,
                 * so that the compression loop is only looking into one table.
                 */
                LZ4_memcpy(streamPtr, streamPtr->dictCtx, sizeof(*streamPtr));
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, noDictIssue, acceleration);
            } else {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingDictCtx, noDictIssue, acceleration);
            }
        } else {
            if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset)) {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, dictSmall, acceleration);
            } else {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, noDictIssue, acceleration);
            }
        }
        streamPtr->dictionary = (const BYTE*)source;
        streamPtr->dictSize = (U32)inputSize;
        return result;
    }
}